

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

int __thiscall FileTokenizer::init(FileTokenizer *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  bool bVar2;
  undefined7 extraout_var;
  ulong uVar4;
  FileTokenizer *extraout_RAX;
  string local_1c0;
  Token local_1a0;
  Token local_140;
  Token local_e0;
  allocator<char> local_69;
  string local_68;
  byte local_41;
  undefined1 local_40 [7];
  bool addSeparator;
  TextFile *local_20;
  TextFile *input_local;
  FileTokenizer *this_local;
  FileTokenizer *pFVar3;
  
  local_20 = (TextFile *)ctx;
  input_local = (TextFile *)this;
  Tokenizer::clearTokens(&this->super_Tokenizer);
  this->lineNumber = 1;
  this->linePos = 0;
  this->equActive = false;
  TextFile::readLine_abi_cxx11_((string *)local_40,local_20);
  std::__cxx11::string::operator=((string *)&this->currentLine,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  this->input = local_20;
  pFVar3 = this;
  if (local_20 != (TextFile *)0x0) {
    bVar2 = TextFile::isOpen(local_20);
    pFVar3 = (FileTokenizer *)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      while (bVar2 = isInputAtEnd(this), ((bVar2 ^ 0xffU) & 1) != 0) {
        local_41 = 1;
        skipWhitespace(this);
        bVar2 = isContinuation(&this->currentLine,this->linePos);
        if (bVar2) {
          this->linePos = this->linePos + 1;
          skipWhitespace(this);
          uVar1 = this->linePos;
          uVar4 = std::__cxx11::string::size();
          if (uVar1 < uVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_68,"Unexpected character after line continuation character",
                       &local_69);
            createToken(this,Invalid,0,&local_68);
            std::__cxx11::string::~string((string *)&local_68);
            std::allocator<char>::~allocator(&local_69);
            Token::Token(&local_e0,&this->token);
            Tokenizer::addToken(&this->super_Tokenizer,&local_e0);
            Token::~Token(&local_e0);
          }
          local_41 = 0;
        }
        else {
          uVar1 = this->linePos;
          uVar4 = std::__cxx11::string::size();
          if (uVar1 < uVar4) {
            loadToken(&local_140,this);
            Tokenizer::addToken(&this->super_Tokenizer,&local_140);
            Token::~Token(&local_140);
          }
        }
        uVar1 = this->linePos;
        uVar4 = std::__cxx11::string::size();
        if (uVar4 <= uVar1) {
          if ((local_41 & 1) != 0) {
            createToken(this,Separator,0);
            Token::Token(&local_1a0,&this->token);
            Tokenizer::addToken(&this->super_Tokenizer,&local_1a0);
            Token::~Token(&local_1a0);
          }
          bVar2 = TextFile::atEnd(local_20);
          if (bVar2) break;
          TextFile::readLine_abi_cxx11_(&local_1c0,local_20);
          std::__cxx11::string::operator=((string *)&this->currentLine,(string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          this->linePos = 0;
          this->lineNumber = this->lineNumber + 1;
        }
      }
      Tokenizer::resetPosition(&this->super_Tokenizer);
      this_local._7_1_ = 1;
      pFVar3 = extraout_RAX;
      goto LAB_00197342;
    }
  }
  this_local._7_1_ = 0;
LAB_00197342:
  return (int)CONCAT71((int7)((ulong)pFVar3 >> 8),this_local._7_1_);
}

Assistant:

bool FileTokenizer::init(TextFile* input)
{
	clearTokens();

	lineNumber = 1;
	linePos = 0;
	equActive = false;
	currentLine = input->readLine();

	this->input = input;
	if (input != nullptr && input->isOpen())
	{
		while (!isInputAtEnd())
		{
			bool addSeparator = true;

			skipWhitespace();
			if (isContinuation(currentLine, linePos))
			{
				linePos++;
				skipWhitespace();
				if (linePos < currentLine.size())
				{
					createToken(TokenType::Invalid,0,
						"Unexpected character after line continuation character");
					addToken(token);
				}

				addSeparator = false;
			} else if(linePos < currentLine.size())
			{
				addToken(loadToken());
			}

			if (linePos >= currentLine.size())
			{
				if (addSeparator)
				{
					createToken(TokenType::Separator,0);
					addToken(token);
				}

				if (input->atEnd())
					break;

				currentLine = input->readLine();
				linePos = 0;
				lineNumber++;
			}
		}

		resetPosition();
		return true;
	}

	return false;
}